

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O1

void __thiscall
Eigen::SparseMatrix<float,_0,_int>::resize(SparseMatrix<float,_0,_int> *this,Index rows,Index cols)

{
  StorageIndex *pSVar1;
  undefined8 *puVar2;
  
  this->m_innerSize = rows;
  (this->m_data).m_size = 0;
  if (this->m_outerSize != cols || this->m_outerSize == 0) {
    free(this->m_outerIndex);
    pSVar1 = (StorageIndex *)malloc(cols * 4 + 4);
    this->m_outerIndex = pSVar1;
    if (pSVar1 == (StorageIndex *)0x0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = boost::program_options::detail::cmdline::cmdline;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    this->m_outerSize = cols;
  }
  if (this->m_innerNonZeros != (StorageIndex *)0x0) {
    free(this->m_innerNonZeros);
    this->m_innerNonZeros = (StorageIndex *)0x0;
  }
  memset(this->m_outerIndex,0,this->m_outerSize * 4 + 4);
  return;
}

Assistant:

void resize(Index rows, Index cols)
    {
      const Index outerSize = IsRowMajor ? rows : cols;
      m_innerSize = IsRowMajor ? cols : rows;
      m_data.clear();
      if (m_outerSize != outerSize || m_outerSize==0)
      {
        std::free(m_outerIndex);
        m_outerIndex = static_cast<StorageIndex*>(std::malloc((outerSize + 1) * sizeof(StorageIndex)));
        if (!m_outerIndex) internal::throw_std_bad_alloc();
        
        m_outerSize = outerSize;
      }
      if(m_innerNonZeros)
      {
        std::free(m_innerNonZeros);
        m_innerNonZeros = 0;
      }
      memset(m_outerIndex, 0, (m_outerSize+1)*sizeof(StorageIndex));
    }